

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O3

int ON_String::ScanBufferVargs(char *buffer,char *format,__va_list_tag *args)

{
  int iVar1;
  
  if (format == (char *)0x0 || buffer == (char *)0x0) {
    return -1;
  }
  iVar1 = __isoc99_vsscanf();
  return iVar1;
}

Assistant:

int ON_String::ScanBufferVargs(
  const char* buffer,
  const char* format,
  va_list args
  )
{
#if defined(ON_COMPILER_CLANG) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  if (nullptr == buffer || nullptr == format)
    return -1;
  return vsscanf(buffer, format, args);
#else
  if (nullptr == buffer || nullptr == format || nullptr == args)
    return -1;
  return vsscanf_l(buffer, ON_Locale::InvariantCulture.NumericLocalePtr(), format, args);
#endif
#else
  if (nullptr == buffer || nullptr == format || nullptr == args)
    return -1;
  return _vsscanf_s_l(buffer, format, ON_Locale::InvariantCulture.NumericLocalePtr(), args);
#endif
}